

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::createImage2DAndBindMemory
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,TimestampTestInstance *this,
          VkFormat format,deUint32 width,deUint32 height,VkImageUsageFlags usage,
          VkSampleCountFlagBits sampleCount,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  deUint64 dVar1;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device;
  InstanceInterface *pIVar2;
  VkPhysicalDevice pVVar3;
  Handle<(vk::HandleType)9> *pHVar4;
  Allocation *pAVar5;
  VkDeviceMemory VVar6;
  VkDeviceSize VVar7;
  VkMemoryRequirements local_510;
  undefined1 local_4f8 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  undefined1 local_4e0 [8];
  VkImageCreateInfo colorImageParams;
  undefined1 local_474 [4];
  uint local_470;
  VkFormatProperties formatProperty;
  undefined1 local_260 [8];
  SimpleAllocator memAlloc;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  VkImageUsageFlags usage_local;
  deUint32 height_local;
  deUint32 width_local;
  VkFormat format_local;
  TimestampTestInstance *this_local;
  Move<vk::Handle<(vk::HandleType)9>_> *image;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  memAlloc.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pIVar2 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&formatProperty.optimalTilingFeatures,pIVar2,pVVar3
            );
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_260,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)&formatProperty.optimalTilingFeatures);
  pIVar2 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar2->_vptr_InstanceInterface[3])(pIVar2,pVVar3,(ulong)format,local_474);
  vk._0_4_ = usage;
  if (((usage & 0x10) != 0) && ((local_470 & 0x80) == 0)) {
    vk._0_4_ = usage & ~VK_SAMPLE_COUNT_16_BIT;
  }
  if ((((VkSampleCountFlagBits)vk & VK_SAMPLE_COUNT_8_BIT) != 0) && ((local_470 & 2) == 0)) {
    vk._0_4_ = (VkSampleCountFlagBits)vk & ~VK_SAMPLE_COUNT_8_BIT;
  }
  local_4e0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  colorImageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageParams._4_4_ = 0;
  colorImageParams.pNext._0_4_ = 0;
  colorImageParams.pNext._4_4_ = 1;
  colorImageParams.extent.width = 1;
  colorImageParams.extent.height = 1;
  colorImageParams.extent.depth = 1;
  colorImageParams.mipLevels = sampleCount;
  colorImageParams.arrayLayers = 0;
  colorImageParams.samples = (VkSampleCountFlagBits)vk;
  colorImageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  colorImageParams.usage = 1;
  colorImageParams._64_8_ = &memAlloc.m_memProps.memoryHeaps[0xf].field_0xc;
  colorImageParams.pQueueFamilyIndices._0_4_ = 0;
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  _15_1_ = 0;
  colorImageParams.flags = format;
  colorImageParams.imageType = width;
  colorImageParams.format = height;
  ::vk::createImage(__return_storage_ptr__,vk_00,device,(VkImageCreateInfo *)local_4e0,
                    (VkAllocationCallbacks *)0x0);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::getImageMemoryRequirements(&local_510,vk_00,device,(VkImage)pHVar4->m_internal);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4f8,
             (SimpleAllocator *)local_260,&local_510,::vk::MemoryRequirement::Any);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar1 = pHVar4->m_internal;
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4f8);
  VVar6 = ::vk::Allocation::getMemory(pAVar5);
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4f8);
  VVar7 = ::vk::Allocation::getOffset(pAVar5);
  result = (*vk_00->_vptr_DeviceInterface[0xd])(vk_00,device,dVar1,VVar6.m_internal,VVar7);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(vkDevice, *image, colorImageAlloc->getMemory(), colorImageAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x38f);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (pAlloc,(MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4f8);
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  _15_1_ = 1;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4f8);
  if ((colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
       _15_1_ & 1) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(__return_storage_ptr__);
  }
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_260);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> TimestampTestInstance::createImage2DAndBindMemory(VkFormat                          format,
																deUint32                          width,
																deUint32                          height,
																VkImageUsageFlags                 usage,
																VkSampleCountFlagBits             sampleCount,
																de::details::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();
	const deUint32              queueFamilyIndex    = m_context.getUniversalQueueFamilyIndex();
	SimpleAllocator             memAlloc            (vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));

	// Optimal tiling feature check
	VkFormatProperties          formatProperty;
	m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), format, &formatProperty);
	if((usage & VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT) && !(formatProperty.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
	{
		// Remove color attachment usage if the optimal tiling feature does not support it
		usage &= ~VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
	}
	if((usage & VK_IMAGE_USAGE_STORAGE_BIT) && !(formatProperty.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
	{
		// Remove storage usage if the optimal tiling feature does not support it
		usage &= ~VK_IMAGE_USAGE_STORAGE_BIT;
	}

	const VkImageCreateInfo colorImageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,                                        // VkStructureType      sType;
		DE_NULL,                                                                    // const void*          pNext;
		0u,                                                                         // VkImageCreateFlags   flags;
		VK_IMAGE_TYPE_2D,                                                           // VkImageType          imageType;
		format,                                                                     // VkFormat             format;
		{ width, height, 1u },                                                      // VkExtent3D           extent;
		1u,                                                                         // deUint32             mipLevels;
		1u,                                                                         // deUint32             arraySize;
		sampleCount,                                                                // deUint32             samples;
		VK_IMAGE_TILING_OPTIMAL,                                                    // VkImageTiling        tiling;
		usage,                                                                      // VkImageUsageFlags    usage;
		VK_SHARING_MODE_EXCLUSIVE,                                                  // VkSharingMode        sharingMode;
		1u,                                                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex,                                                          // const deUint32*      pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,                                                  // VkImageLayout        initialLayout;
	};

	Move<VkImage> image = createImage(vk, vkDevice, &colorImageParams);

	// Allocate and bind image memory
	de::MovePtr<Allocation> colorImageAlloc = memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any);
	VK_CHECK(vk.bindImageMemory(vkDevice, *image, colorImageAlloc->getMemory(), colorImageAlloc->getOffset()));

	DE_ASSERT(pAlloc);
	*pAlloc = colorImageAlloc;

	return image;
}